

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::ELU_x86_avx512::forward_inplace(ELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  _func_int **pp_Var3;
  bool bVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong uVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ulong uVar17;
  undefined1 (*pauVar18) [64];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar19 [16];
  undefined1 auVar24 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 extraout_var [60];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float afVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float afVar50 [16];
  float afVar51 [16];
  float afVar52 [16];
  float afVar53 [16];
  float afVar54 [16];
  float afVar55 [16];
  float afVar56 [16];
  undefined1 in_ZMM20 [64];
  undefined1 auVar57 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar30 [32];
  
  iVar16 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->elempack;
  pp_Var3 = this->_vptr_ELU_x86_avx512;
  auVar32 = vbroadcastss_avx512f(ZEXT416(0x80000000));
  auVar33 = vxorps_avx512dq(auVar32,(undefined1  [64])_ps512_cephes_exp_C1);
  auVar32 = vxorps_avx512dq(auVar32,(undefined1  [64])_ps512_cephes_exp_C2);
  auVar34 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
  uVar17 = 0;
  uVar14 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar14 = uVar17;
  }
  auVar35 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
  auVar19 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
  auVar57 = ZEXT1664(auVar19);
  auVar19 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar58 = ZEXT1664(auVar19);
  auVar24 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
  auVar59 = ZEXT3264(auVar24);
  auVar24 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
  auVar60 = ZEXT3264(auVar24);
  auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar61 = ZEXT3264(auVar24);
  auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
  auVar62 = ZEXT3264(auVar24);
  auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar64 = ZEXT3264(auVar24);
  auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
  auVar65 = ZEXT3264(auVar24);
  auVar24 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
  auVar66 = ZEXT3264(auVar24);
  auVar24 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
  auVar67 = ZEXT3264(auVar24);
  auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
  auVar68 = ZEXT3264(auVar24);
  auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
  auVar69 = ZEXT3264(auVar24);
  afVar47 = _ps512_1;
  afVar50 = _ps512_cephes_LOG2EF;
  afVar51 = _ps512_cephes_exp_p5;
  afVar52 = _ps512_cephes_exp_p0;
  afVar53 = _ps512_cephes_exp_p1;
  afVar54 = _ps512_cephes_exp_p2;
  afVar55 = _ps512_cephes_exp_p3;
  afVar56 = _ps512_cephes_exp_p4;
  for (; uVar17 != uVar14; uVar17 = uVar17 + 1) {
    pauVar18 = (undefined1 (*) [64])
               (bottom_top_blob->cstep * uVar17 * bottom_top_blob->elemsize +
               (long)bottom_top_blob->data);
    auVar36 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd0 + (long)pp_Var3[-3])));
    for (iVar15 = 0; iVar15 + 0xf < iVar16; iVar15 = iVar15 + 0x10) {
      auVar37 = vmaxps_avx512f(*pauVar18,auVar57);
      auVar38 = vminps_avx512f(*pauVar18,auVar57);
      auVar38 = vminps_avx512f(auVar38,(undefined1  [64])_ps512_exp_hi);
      auVar38 = vmaxps_avx512f(auVar38,(undefined1  [64])_ps512_exp_lo);
      auVar39 = vfmadd213ps_avx512f((undefined1  [64])afVar50,auVar38,(undefined1  [64])afVar51);
      auVar40 = vrndscaleps_avx512f(auVar39,1);
      uVar6 = vcmpps_avx512f(auVar39,auVar40,1);
      auVar39 = vsubps_avx512f(auVar40,(undefined1  [64])afVar47);
      bVar4 = (bool)((byte)uVar6 & 1);
      auVar41._0_4_ = (uint)bVar4 * auVar39._0_4_ | (uint)!bVar4 * auVar40._0_4_;
      bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
      auVar41._4_4_ = (uint)bVar4 * auVar39._4_4_ | (uint)!bVar4 * auVar40._4_4_;
      bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
      auVar41._8_4_ = (uint)bVar4 * auVar39._8_4_ | (uint)!bVar4 * auVar40._8_4_;
      bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
      auVar41._12_4_ = (uint)bVar4 * auVar39._12_4_ | (uint)!bVar4 * auVar40._12_4_;
      bVar4 = (bool)((byte)(uVar6 >> 4) & 1);
      auVar41._16_4_ = (uint)bVar4 * auVar39._16_4_ | (uint)!bVar4 * auVar40._16_4_;
      bVar4 = (bool)((byte)(uVar6 >> 5) & 1);
      auVar41._20_4_ = (uint)bVar4 * auVar39._20_4_ | (uint)!bVar4 * auVar40._20_4_;
      bVar4 = (bool)((byte)(uVar6 >> 6) & 1);
      auVar41._24_4_ = (uint)bVar4 * auVar39._24_4_ | (uint)!bVar4 * auVar40._24_4_;
      bVar4 = (bool)((byte)(uVar6 >> 7) & 1);
      auVar41._28_4_ = (uint)bVar4 * auVar39._28_4_ | (uint)!bVar4 * auVar40._28_4_;
      bVar4 = (bool)((byte)(uVar6 >> 8) & 1);
      auVar41._32_4_ = (uint)bVar4 * auVar39._32_4_ | (uint)!bVar4 * auVar40._32_4_;
      bVar4 = (bool)((byte)(uVar6 >> 9) & 1);
      auVar41._36_4_ = (uint)bVar4 * auVar39._36_4_ | (uint)!bVar4 * auVar40._36_4_;
      bVar4 = (bool)((byte)(uVar6 >> 10) & 1);
      auVar41._40_4_ = (uint)bVar4 * auVar39._40_4_ | (uint)!bVar4 * auVar40._40_4_;
      bVar4 = (bool)((byte)(uVar6 >> 0xb) & 1);
      auVar41._44_4_ = (uint)bVar4 * auVar39._44_4_ | (uint)!bVar4 * auVar40._44_4_;
      bVar4 = (bool)((byte)(uVar6 >> 0xc) & 1);
      auVar41._48_4_ = (uint)bVar4 * auVar39._48_4_ | (uint)!bVar4 * auVar40._48_4_;
      bVar4 = (bool)((byte)(uVar6 >> 0xd) & 1);
      auVar41._52_4_ = (uint)bVar4 * auVar39._52_4_ | (uint)!bVar4 * auVar40._52_4_;
      bVar4 = (bool)((byte)(uVar6 >> 0xe) & 1);
      auVar41._56_4_ = (uint)bVar4 * auVar39._56_4_ | (uint)!bVar4 * auVar40._56_4_;
      bVar4 = SUB81(uVar6 >> 0xf,0);
      auVar41._60_4_ = (uint)bVar4 * auVar39._60_4_ | (uint)!bVar4 * auVar40._60_4_;
      auVar38 = vfmadd231ps_avx512f(auVar38,auVar41,auVar33);
      auVar38 = vfmadd231ps_avx512f(auVar38,auVar41,auVar32);
      auVar39 = vmulps_avx512f(auVar38,auVar38);
      auVar40 = vfmadd213ps_avx512f(auVar38,(undefined1  [64])afVar52,(undefined1  [64])afVar53);
      auVar40 = vfmadd213ps_avx512f(auVar40,auVar38,(undefined1  [64])afVar54);
      auVar40 = vfmadd213ps_avx512f(auVar40,auVar38,(undefined1  [64])afVar55);
      auVar40 = vfmadd213ps_avx512f(auVar40,auVar38,(undefined1  [64])afVar56);
      auVar40 = vfmadd213ps_avx512f(auVar40,auVar38,(undefined1  [64])afVar51);
      auVar38 = vfmadd213ps_avx512f(auVar40,auVar39,auVar38);
      auVar38 = vaddps_avx512f(auVar38,(undefined1  [64])afVar47);
      auVar39 = vcvttps2dq_avx512f(auVar41);
      auVar39 = vpaddd_avx512f(auVar34,auVar39);
      auVar39 = vpslld_avx512f(auVar39,0x17);
      auVar38 = vfmadd213ps_avx512f(auVar39,auVar38,auVar35);
      auVar37 = vfmadd213ps_avx512f(auVar38,auVar36,auVar37);
      *pauVar18 = auVar37;
      pauVar18 = pauVar18 + 1;
    }
    uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
    auVar24._4_4_ = uVar1;
    auVar24._0_4_ = uVar1;
    auVar24._8_4_ = uVar1;
    auVar24._12_4_ = uVar1;
    auVar24._16_4_ = uVar1;
    auVar24._20_4_ = uVar1;
    auVar24._24_4_ = uVar1;
    auVar24._28_4_ = uVar1;
    for (; iVar15 + 7 < iVar16; iVar15 = iVar15 + 8) {
      auVar25 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar18,auVar58._0_32_);
      auVar26 = vminps_avx512vl(*(undefined1 (*) [32])*pauVar18,auVar58._0_32_);
      auVar26 = vminps_avx512vl(auVar26,auVar59._0_32_);
      auVar27 = vmaxps_avx512vl(auVar26,auVar60._0_32_);
      auVar28 = vfmadd231ps_avx512vl(auVar61._0_32_,auVar27,auVar62._0_32_);
      auVar26 = vroundps_avx(auVar28,1);
      uVar6 = vcmpps_avx512vl(auVar28,auVar26,1);
      auVar63 = auVar64._0_32_;
      auVar29 = vsubps_avx512vl(auVar26,auVar63);
      bVar4 = (bool)((byte)uVar6 & 1);
      auVar30._0_4_ = (float)((uint)bVar4 * auVar29._0_4_ | (uint)!bVar4 * auVar26._0_4_);
      bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
      auVar30._4_4_ = (float)((uint)bVar4 * auVar29._4_4_ | (uint)!bVar4 * auVar26._4_4_);
      bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
      auVar30._8_4_ = (float)((uint)bVar4 * auVar29._8_4_ | (uint)!bVar4 * auVar26._8_4_);
      bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
      auVar30._12_4_ = (float)((uint)bVar4 * auVar29._12_4_ | (uint)!bVar4 * auVar26._12_4_);
      bVar4 = (bool)((byte)(uVar6 >> 4) & 1);
      auVar30._16_4_ = (float)((uint)bVar4 * auVar29._16_4_ | (uint)!bVar4 * auVar26._16_4_);
      bVar4 = (bool)((byte)(uVar6 >> 5) & 1);
      auVar30._20_4_ = (float)((uint)bVar4 * auVar29._20_4_ | (uint)!bVar4 * auVar26._20_4_);
      bVar4 = (bool)((byte)(uVar6 >> 6) & 1);
      auVar30._24_4_ = (float)((uint)bVar4 * auVar29._24_4_ | (uint)!bVar4 * auVar26._24_4_);
      bVar4 = SUB81(uVar6 >> 7,0);
      auVar30._28_4_ = (float)((uint)bVar4 * auVar29._28_4_ | (uint)!bVar4 * auVar26._28_4_);
      auVar26 = vfmsub231ps_avx512vl(auVar27,auVar30,auVar65._0_32_);
      auVar31 = vfmsub231ps_avx512vl(auVar26,auVar30,auVar66._0_32_);
      auVar29._4_4_ = auVar31._4_4_ * auVar31._4_4_;
      auVar29._0_4_ = auVar31._0_4_ * auVar31._0_4_;
      auVar29._8_4_ = auVar31._8_4_ * auVar31._8_4_;
      auVar29._12_4_ = auVar31._12_4_ * auVar31._12_4_;
      auVar29._16_4_ = auVar31._16_4_ * auVar31._16_4_;
      auVar29._20_4_ = auVar31._20_4_ * auVar31._20_4_;
      auVar29._24_4_ = auVar31._24_4_ * auVar31._24_4_;
      auVar29._28_4_ = auVar28._28_4_;
      auVar26 = vfmadd213ps_avx512vl(auVar67._0_32_,auVar31,auVar68._0_32_);
      auVar27 = vfmadd213ps_avx512vl(auVar26,auVar31,auVar69._0_32_);
      auVar26._8_4_ = 0x3d2aa9c1;
      auVar26._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar26._12_4_ = 0x3d2aa9c1;
      auVar26._16_4_ = 0x3d2aa9c1;
      auVar26._20_4_ = 0x3d2aa9c1;
      auVar26._24_4_ = 0x3d2aa9c1;
      auVar26._28_4_ = 0x3d2aa9c1;
      auVar26 = vfmadd213ps_avx512vl(auVar27,auVar31,auVar26);
      auVar27._8_4_ = 0x3e2aaaaa;
      auVar27._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar27._12_4_ = 0x3e2aaaaa;
      auVar27._16_4_ = 0x3e2aaaaa;
      auVar27._20_4_ = 0x3e2aaaaa;
      auVar27._24_4_ = 0x3e2aaaaa;
      auVar27._28_4_ = 0x3e2aaaaa;
      auVar26 = vfmadd213ps_avx512vl(auVar26,auVar31,auVar27);
      auVar26 = vfmadd213ps_avx512vl(auVar26,auVar31,auVar61._0_32_);
      auVar19 = vfmadd213ps_fma(auVar26,auVar29,auVar31);
      auVar26 = vaddps_avx512vl(ZEXT1632(auVar19),auVar63);
      auVar31._0_4_ = (int)auVar30._0_4_;
      auVar31._4_4_ = (int)auVar30._4_4_;
      auVar31._8_4_ = (int)auVar30._8_4_;
      auVar31._12_4_ = (int)auVar30._12_4_;
      auVar31._16_4_ = (int)auVar30._16_4_;
      auVar31._20_4_ = (int)auVar30._20_4_;
      auVar31._24_4_ = (int)auVar30._24_4_;
      auVar31._28_4_ = (int)auVar30._28_4_;
      auVar27 = vpslld_avx2(auVar31,0x17);
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar28._16_4_ = 0x3f800000;
      auVar28._20_4_ = 0x3f800000;
      auVar28._24_4_ = 0x3f800000;
      auVar28._28_4_ = 0x3f800000;
      auVar27 = vpaddd_avx512vl(auVar27,auVar28);
      auVar26 = vfmsub213ps_avx512vl(auVar27,auVar26,auVar63);
      auVar19 = vfmadd213ps_fma(auVar26,auVar24,auVar25);
      *(undefined1 (*) [32])*pauVar18 = ZEXT1632(auVar19);
      pauVar18 = (undefined1 (*) [64])(*pauVar18 + 0x20);
    }
    uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
    auVar19._4_4_ = uVar1;
    auVar19._0_4_ = uVar1;
    auVar19._8_4_ = uVar1;
    auVar19._12_4_ = uVar1;
    for (; iVar15 + 3 < iVar16; iVar15 = iVar15 + 4) {
      auVar5 = vmaxps_avx(*(undefined1 (*) [16])*pauVar18,ZEXT816(0) << 0x40);
      auVar23 = vminps_avx(*(undefined1 (*) [16])*pauVar18,ZEXT816(0) << 0x40);
      auVar20._8_4_ = 0x42b0c0a5;
      auVar20._0_8_ = 0x42b0c0a542b0c0a5;
      auVar20._12_4_ = 0x42b0c0a5;
      auVar20 = vminps_avx512vl(auVar23,auVar20);
      auVar23._8_4_ = 0xc2b0c0a5;
      auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar23._12_4_ = 0xc2b0c0a5;
      auVar20 = vmaxps_avx512vl(auVar20,auVar23);
      auVar48._8_4_ = 0x3f000000;
      auVar48._0_8_ = 0x3f0000003f000000;
      auVar48._12_4_ = 0x3f000000;
      auVar21._8_4_ = 0x3fb8aa3b;
      auVar21._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar21._12_4_ = 0x3fb8aa3b;
      auVar21 = vfmadd231ps_avx512vl(auVar48,auVar20,auVar21);
      auVar45._0_4_ = (int)auVar21._0_4_;
      auVar45._4_4_ = (int)auVar21._4_4_;
      auVar45._8_4_ = (int)auVar21._8_4_;
      auVar45._12_4_ = (int)auVar21._12_4_;
      auVar23 = vcvtdq2ps_avx(auVar45);
      uVar6 = vcmpps_avx512vl(auVar21,auVar23,1);
      auVar49._8_4_ = 0x3f800000;
      auVar49._0_8_ = 0x3f8000003f800000;
      auVar49._12_4_ = 0x3f800000;
      auVar21 = vsubps_avx512vl(auVar23,auVar49);
      bVar4 = (bool)((byte)uVar6 & 1);
      auVar22._0_4_ = (float)((uint)bVar4 * auVar21._0_4_ | (uint)!bVar4 * auVar23._0_4_);
      bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
      auVar22._4_4_ = (float)((uint)bVar4 * auVar21._4_4_ | (uint)!bVar4 * auVar23._4_4_);
      bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
      auVar22._8_4_ = (float)((uint)bVar4 * auVar21._8_4_ | (uint)!bVar4 * auVar23._8_4_);
      bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
      auVar22._12_4_ = (float)((uint)bVar4 * auVar21._12_4_ | (uint)!bVar4 * auVar23._12_4_);
      auVar7._8_4_ = 0x3f318000;
      auVar7._0_8_ = 0x3f3180003f318000;
      auVar7._12_4_ = 0x3f318000;
      auVar23 = vfmsub231ps_avx512vl(auVar20,auVar22,auVar7);
      auVar8._8_4_ = 0x395e8083;
      auVar8._0_8_ = 0x395e8083395e8083;
      auVar8._12_4_ = 0x395e8083;
      auVar20 = vfmsub231ps_avx512vl(auVar23,auVar22,auVar8);
      auVar43._0_4_ = auVar20._0_4_ * auVar20._0_4_;
      auVar43._4_4_ = auVar20._4_4_ * auVar20._4_4_;
      auVar43._8_4_ = auVar20._8_4_ * auVar20._8_4_;
      auVar43._12_4_ = auVar20._12_4_ * auVar20._12_4_;
      auVar46._8_4_ = 0x39506967;
      auVar46._0_8_ = 0x3950696739506967;
      auVar46._12_4_ = 0x39506967;
      auVar9._8_4_ = 0x3ab743ce;
      auVar9._0_8_ = 0x3ab743ce3ab743ce;
      auVar9._12_4_ = 0x3ab743ce;
      auVar23 = vfmadd213ps_avx512vl(auVar46,auVar20,auVar9);
      auVar10._8_4_ = 0x3c088908;
      auVar10._0_8_ = 0x3c0889083c088908;
      auVar10._12_4_ = 0x3c088908;
      auVar23 = vfmadd213ps_avx512vl(auVar23,auVar20,auVar10);
      auVar11._8_4_ = 0x3d2aa9c1;
      auVar11._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar11._12_4_ = 0x3d2aa9c1;
      auVar23 = vfmadd213ps_avx512vl(auVar23,auVar20,auVar11);
      auVar12._8_4_ = 0x3e2aaaaa;
      auVar12._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar12._12_4_ = 0x3e2aaaaa;
      auVar23 = vfmadd213ps_avx512vl(auVar23,auVar20,auVar12);
      auVar23 = vfmadd213ps_fma(auVar23,auVar20,auVar48);
      auVar23 = vfmadd213ps_fma(auVar23,auVar43,auVar20);
      auVar42._0_4_ = auVar23._0_4_ + 1.0;
      auVar42._4_4_ = auVar23._4_4_ + 1.0;
      auVar42._8_4_ = auVar23._8_4_ + 1.0;
      auVar42._12_4_ = auVar23._12_4_ + 1.0;
      auVar44._0_4_ = (int)auVar22._0_4_;
      auVar44._4_4_ = (int)auVar22._4_4_;
      auVar44._8_4_ = (int)auVar22._8_4_;
      auVar44._12_4_ = (int)auVar22._12_4_;
      auVar23 = vpslld_avx(auVar44,0x17);
      auVar13._8_4_ = 0x3f800000;
      auVar13._0_8_ = 0x3f8000003f800000;
      auVar13._12_4_ = 0x3f800000;
      auVar23 = vpaddd_avx512vl(auVar23,auVar13);
      auVar23 = vfmsub213ps_fma(auVar23,auVar42,auVar49);
      auVar23 = vfmadd213ps_fma(auVar23,auVar19,auVar5);
      *(undefined1 (*) [16])*pauVar18 = auVar23;
      pauVar18 = (undefined1 (*) [64])(*pauVar18 + 0x10);
    }
    while( true ) {
      auVar19 = auVar57._0_16_;
      auVar23 = auVar58._0_16_;
      if (iVar16 <= iVar15) break;
      if (*(float *)*pauVar18 < 0.0) {
        uVar2 = *(uint *)(&this->field_0xd0 + (long)pp_Var3[-3]);
        auVar36._0_4_ = expf(*(float *)*pauVar18);
        afVar51 = _ps512_cephes_exp_p5;
        afVar56 = _ps512_cephes_exp_p4;
        afVar55 = _ps512_cephes_exp_p3;
        afVar54 = _ps512_cephes_exp_p2;
        afVar53 = _ps512_cephes_exp_p1;
        afVar52 = _ps512_cephes_exp_p0;
        afVar50 = _ps512_cephes_LOG2EF;
        afVar47 = _ps512_1;
        auVar36._4_60_ = extraout_var;
        auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar69 = ZEXT3264(auVar24);
        auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar68 = ZEXT3264(auVar24);
        auVar24 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar67 = ZEXT3264(auVar24);
        auVar24 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
        auVar66 = ZEXT3264(auVar24);
        auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar65 = ZEXT3264(auVar24);
        auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar64 = ZEXT3264(auVar24);
        auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar62 = ZEXT3264(auVar24);
        auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar61 = ZEXT3264(auVar24);
        auVar24 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar60 = ZEXT3264(auVar24);
        auVar24 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar59 = ZEXT3264(auVar24);
        auVar23 = vxorps_avx512vl(auVar23,auVar23);
        auVar58 = ZEXT1664(auVar23);
        auVar19 = vxorps_avx512vl(auVar19,auVar19);
        auVar57 = ZEXT1664(auVar19);
        auVar35 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
        auVar34 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
        auVar19 = vfmsub213ss_fma(auVar36._0_16_,ZEXT416(uVar2),ZEXT416(uVar2));
        *(int *)*pauVar18 = auVar19._0_4_;
      }
      pauVar18 = (undefined1 (*) [64])(*pauVar18 + 4);
      iVar15 = iVar15 + 1;
    }
  }
  return 0;
}

Assistant:

int ELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}